

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted-payload.c
# Opt level: O3

int ndn_parse_encrypted_payload
              (uint8_t *input,uint32_t input_size,uint8_t *output,uint32_t *output_size,
              uint32_t aes_key_id)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ndn_aes_key_t *aes_key;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint8_t *aes_iv;
  uint8_t *input_value;
  uint32_t input_size_00;
  ulong uVar10;
  
  uVar3 = 0;
  input_size_00 = 0;
  aes_iv = (uint8_t *)0x0;
  input_value = (uint8_t *)0x0;
  do {
    iVar2 = (int)uVar3;
    bVar1 = input[uVar3];
    uVar5 = (uint)bVar1;
    if (bVar1 < 0xfd) {
      iVar8 = 1;
    }
    else if ((input_size - iVar2 < 3) || (bVar1 != 0xfd)) {
      if (input_size - iVar2 < 5) {
        return -0xe;
      }
      if (bVar1 != 0xfe) {
        return -0xe;
      }
      uVar5 = (uint)input[iVar2 + 4] |
              (uint)input[iVar2 + 3] << 8 |
              (uint)input[iVar2 + 2] << 0x10 | (uint)input[iVar2 + 1] << 0x18;
      iVar8 = 5;
    }
    else {
      uVar5 = (uint)CONCAT11(input[iVar2 + 1],input[iVar2 + 2]);
      iVar8 = 3;
    }
    uVar9 = iVar8 + iVar2;
    bVar1 = input[uVar9];
    uVar7 = (uint)bVar1;
    if (bVar1 < 0xfd) {
      iVar2 = 1;
    }
    else if ((bVar1 == 0xfd) && (2 < input_size - uVar9)) {
      uVar7 = (uint)CONCAT11(input[uVar9 + 1],input[uVar9 + 2]);
      iVar2 = 3;
    }
    else {
      if (bVar1 != 0xfe) {
        return -0xe;
      }
      if (input_size - uVar9 < 5) {
        return -0xe;
      }
      uVar7 = (uint)input[uVar9 + 4] |
              (uint)input[uVar9 + 3] << 8 |
              (uint)input[uVar9 + 2] << 0x10 | (uint)input[uVar9 + 1] << 0x18;
      iVar2 = 5;
    }
    uVar9 = iVar2 + uVar9;
    uVar4 = (ulong)uVar9;
    if (uVar5 == 0x81) {
      uVar10 = 0;
      if (uVar9 + 4 <= input_size) {
        uVar10 = 0;
        lVar6 = 0x20;
        do {
          lVar6 = lVar6 + -8;
          uVar10 = (ulong)((int)uVar10 + ((uint)input[uVar4] << ((byte)lVar6 & 0x1f)));
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (lVar6 != 0);
        uVar4 = (ulong)(uVar9 + 4);
      }
      iVar2 = (int)uVar10 - aes_key_id;
      uVar3 = uVar4;
      if (iVar2 != 0) {
        printf("ERROR: %s, L%d: ","ndn_parse_encrypted_payload",0x75);
        printf("[ENCODING] Received KeyID %u and Input KeyID %u not match\n",uVar10,
               (ulong)aes_key_id);
        return iVar2;
      }
    }
    else if (uVar5 == 0x88) {
      input_value = input + uVar4;
      uVar3 = (ulong)(uVar9 + uVar7);
      input_size_00 = uVar7;
      if (input_size < uVar9 + uVar7) {
        uVar3 = uVar4;
      }
    }
    else if (uVar5 == 0x87) {
      if (uVar7 != 0x10) {
        return -0xd;
      }
      aes_iv = input + uVar9;
      uVar5 = uVar9 + 0x10;
      if (input_size < uVar9 + 0x10) {
        uVar5 = uVar9;
      }
      uVar3 = (ulong)uVar5;
    }
    else {
      uVar3 = (ulong)(uVar7 + uVar9);
      if (input_size < uVar7 + uVar9) {
        uVar3 = uVar4;
      }
    }
    if (input_value != (uint8_t *)0x0 && aes_iv != (uint8_t *)0x0) {
      aes_key = ndn_key_storage_get_aes_key(aes_key_id);
      if (aes_key == (ndn_aes_key_t *)0x0) {
        return -0x49;
      }
      iVar2 = ndn_aes_cbc_decrypt(input_value,input_size_00,output,output_size,aes_iv,aes_key);
      return iVar2;
    }
  } while( true );
}

Assistant:

int
ndn_parse_encrypted_payload(const uint8_t* input, uint32_t input_size,
                            uint8_t* output, uint32_t* output_size, uint32_t aes_key_id)
{
  int ret_val = -1;
  uint32_t type = 0;
  uint32_t length = 0;
  uint32_t encrypted_payload_length = 0;
  const uint8_t* iv = NULL;
  const uint8_t* encrypted_payload = NULL;
  ndn_decoder_t decoder;
  decoder_init(&decoder, input, input_size);

  do {
    ret_val = decoder_get_type(&decoder, &type);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = decoder_get_length(&decoder, &length);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (type == TLV_AC_AES_IV) {
      if (length != NDN_AES_BLOCK_SIZE) return NDN_WRONG_TLV_LENGTH;
      iv = decoder.input_value + decoder.offset;
      decoder_move_forward(&decoder, length);
    }
    else if (type == TLV_AC_KEYID) {
      uint32_t keyid = 0;
      decoder_get_uint32_value(&decoder, &keyid);
      if (keyid != aes_key_id) {
        NDN_LOG_ERROR("[ENCODING] Received KeyID %u and Input KeyID %u not match\n", keyid, aes_key_id);
        return keyid - aes_key_id;
      }
    }
    else if (type == TLV_AC_ENCRYPTED_PAYLOAD) {
      encrypted_payload = decoder.input_value + decoder.offset;
      encrypted_payload_length = length;
      decoder_move_forward(&decoder, length);
    }
    else {
      decoder_move_forward(&decoder, length);
    }
  }
  while (iv == NULL || encrypted_payload == NULL);

  ndn_aes_key_t* key = ndn_key_storage_get_aes_key(aes_key_id);
  if (key == NULL) {
    return NDN_AC_KEY_NOT_FOUND;
  }
  ret_val = ndn_aes_cbc_decrypt(encrypted_payload, encrypted_payload_length,
                                output, output_size, iv, key);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}